

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O3

bool __thiscall HighsLp::hasInfiniteCost(HighsLp *this,double infinite_cost)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = (ulong)this->num_col_;
  if ((long)uVar4 < 1) {
    return false;
  }
  pdVar2 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = *pdVar2;
  bVar6 = true;
  if ((dVar1 < infinite_cost) && (-infinite_cost < dVar1)) {
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if ((uVar4 == uVar5) || (dVar1 = pdVar2[uVar5], infinite_cost <= dVar1)) break;
      uVar3 = uVar5 + 1;
    } while (-infinite_cost < dVar1);
    bVar6 = uVar5 < uVar4;
  }
  return bVar6;
}

Assistant:

bool HighsLp::hasInfiniteCost(const double infinite_cost) const {
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    if (this->col_cost_[iCol] >= infinite_cost) return true;
    if (this->col_cost_[iCol] <= -infinite_cost) return true;
  }
  return false;
}